

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O1

void __thiscall Diligent::DeviceContextGLImpl::BeginSubpass(DeviceContextGLImpl *this)

{
  uint uVar1;
  uint uVar2;
  RenderPassGLImpl *Args_1;
  pointer pSVar3;
  SubpassDesc *pSVar4;
  AttachmentReference *pAVar5;
  ITextureView *pIVar6;
  ITexture *pIVar7;
  pointer pOVar8;
  GLFBOCreateReleaseHelper CreateReleaseHelper;
  ulong uVar9;
  RenderPassAttachmentDesc *pRVar10;
  TextureFormatAttribs *pTVar11;
  char (*in_RCX) [20];
  ulong uVar12;
  bool bVar13;
  string msg;
  string local_60;
  FramebufferGLImpl *local_40;
  GLContextState *local_38;
  
  if ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pActiveRenderPass.m_pObject ==
      (RenderPassGLImpl *)0x0) {
    FormatString<char[26],char[20]>
              (&local_60,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pActiveRenderPass",in_RCX);
    in_RCX = (char (*) [20])0x1ce;
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"BeginSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x1ce);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,
                      CONCAT44(local_60.field_2._M_allocated_capacity._4_4_,
                               local_60.field_2._M_allocated_capacity._0_4_) + 1);
    }
  }
  if ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pBoundFramebuffer.m_pObject ==
      (FramebufferGLImpl *)0x0) {
    FormatString<char[26],char[20]>
              (&local_60,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pBoundFramebuffer",in_RCX);
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"BeginSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x1cf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,
                      CONCAT44(local_60.field_2._M_allocated_capacity._4_4_,
                               local_60.field_2._M_allocated_capacity._0_4_) + 1);
    }
  }
  Args_1 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pActiveRenderPass.
           m_pObject;
  if ((Args_1->super_RenderPassBase<Diligent::EngineGLImplTraits>).
      super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
      .m_Desc.SubpassCount <=
      (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_SubpassIndex) {
    FormatString<char[26],char[37]>
              (&local_60,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_SubpassIndex < RPDesc.SubpassCount",(char (*) [37])Args_1);
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"BeginSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x1d1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,
                      CONCAT44(local_60.field_2._M_allocated_capacity._4_4_,
                               local_60.field_2._M_allocated_capacity._0_4_) + 1);
    }
  }
  uVar1 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_SubpassIndex;
  local_40 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pBoundFramebuffer.
             m_pObject;
  pSVar3 = (local_40->m_SubpassFramebuffers).
           super__Vector_base<Diligent::FramebufferGLImpl::SubpassFramebuffers,_std::allocator<Diligent::FramebufferGLImpl::SubpassFramebuffers>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar4 = (Args_1->super_RenderPassBase<Diligent::EngineGLImplTraits>).
           super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
           .m_Desc.pSubpasses;
  if (pSVar3[uVar1].RenderTarget.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.
      m_uiHandle == 0) {
    CreateReleaseHelper.m_ExternalFBOHandle =
         (*(((this->m_pSwapChain).m_pObject)->super_ISwapChain).super_IObject._vptr_IObject[0xc])();
    if ((this->m_DefaultFBO).super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.
        m_uiHandle != CreateReleaseHelper.m_ExternalFBOHandle) {
      GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>::GLObjWrapper
                ((GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper> *)&local_60,true,
                 CreateReleaseHelper);
      local_60._M_string_length._4_4_ = 0xffffffff;
      local_60.field_2._M_allocated_capacity._0_4_ = 0;
      GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>::operator=
                (&(this->m_DefaultFBO).
                  super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>,
                 (GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper> *)&local_60);
      (this->m_DefaultFBO).m_NumDrawBuffers = local_60._M_string_length._4_4_;
      (this->m_DefaultFBO).m_DrawBuffersMask = local_60.field_2._M_allocated_capacity._0_4_;
      local_60._M_string_length._4_4_ = 0;
      local_60.field_2._M_allocated_capacity._0_4_ = 0;
      GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>::~GLObjWrapper
                ((GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper> *)&local_60);
    }
    GLContextState::BindFBO(&this->m_ContextState,&this->m_DefaultFBO);
    this->m_DrawFBO = (GLFrameBufferObj *)0x0;
  }
  else {
    pSVar3 = pSVar3 + uVar1;
    GLContextState::BindFBO(&this->m_ContextState,&pSVar3->RenderTarget);
    this->m_DrawFBO = &pSVar3->RenderTarget;
    this->m_DrawBuffersCommitted = false;
  }
  if (pSVar4[uVar1].RenderTargetAttachmentCount != 0) {
    local_38 = &this->m_ContextState;
    uVar12 = 0;
    do {
      pAVar5 = pSVar4[uVar1].pRenderTargetAttachments;
      uVar9 = (ulong)pAVar5[uVar12].AttachmentIndex;
      if ((uVar9 != 0xffffffff) &&
         (pIVar6 = (local_40->super_FramebufferBase<Diligent::EngineGLImplTraits>).
                   super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                   .m_Desc.ppAttachments[uVar9], pIVar6 != (ITextureView *)0x0)) {
        CheckDynamicType<Diligent::TextureViewGLImpl,Diligent::ITextureView>(pIVar6);
        pIVar7 = (ITexture *)pIVar6[0xb].super_IDeviceObject.super_IObject._vptr_IObject;
        if (pIVar7 != (ITexture *)0x0) {
          CheckDynamicType<Diligent::TextureBaseGL,Diligent::ITexture>(pIVar7);
        }
        GLContextState::EnsureMemoryBarrier
                  (local_38,MEMORY_BARRIER_FRAMEBUFFER,(AsyncWritableResource *)(pIVar7 + 0x14));
        uVar2 = pAVar5[uVar12].AttachmentIndex;
        if (((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_SubpassIndex ==
             (((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pActiveRenderPass.
              m_pObject)->super_RenderPassBase<Diligent::EngineGLImplTraits>).
             m_AttachmentFirstLastUse[uVar2].first) &&
           ((Args_1->super_RenderPassBase<Diligent::EngineGLImplTraits>).
            super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
            .m_Desc.pAttachments[uVar2].LoadOp == ATTACHMENT_LOAD_OP_CLEAR)) {
          ClearRenderTarget(this,pIVar6,
                            (this->m_AttachmentClearValues).
                            super__Vector_base<Diligent::OptimizedClearValue,_std::allocator<Diligent::OptimizedClearValue>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar2].Color,
                            RESOURCE_STATE_TRANSITION_MODE_NONE);
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < pSVar4[uVar1].RenderTargetAttachmentCount);
  }
  if (((pSVar4[uVar1].pDepthStencilAttachment != (AttachmentReference *)0x0) &&
      (uVar12 = (ulong)(pSVar4[uVar1].pDepthStencilAttachment)->AttachmentIndex,
      uVar12 != 0xffffffff)) &&
     (pIVar6 = (local_40->super_FramebufferBase<Diligent::EngineGLImplTraits>).
               super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
               .m_Desc.ppAttachments[uVar12], pIVar6 != (ITextureView *)0x0)) {
    CheckDynamicType<Diligent::TextureViewGLImpl,Diligent::ITextureView>(pIVar6);
    pIVar7 = (ITexture *)pIVar6[0xb].super_IDeviceObject.super_IObject._vptr_IObject;
    if (pIVar7 != (ITexture *)0x0) {
      CheckDynamicType<Diligent::TextureBaseGL,Diligent::ITexture>(pIVar7);
    }
    GLContextState::EnsureMemoryBarrier
              (&this->m_ContextState,MEMORY_BARRIER_FRAMEBUFFER,
               (AsyncWritableResource *)(pIVar7 + 0x14));
    if (((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_SubpassIndex ==
         (((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pActiveRenderPass.
          m_pObject)->super_RenderPassBase<Diligent::EngineGLImplTraits>).m_AttachmentFirstLastUse
         [uVar12].first) &&
       (pRVar10 = (Args_1->super_RenderPassBase<Diligent::EngineGLImplTraits>).
                  super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
                  .m_Desc.pAttachments + uVar12, pRVar10->LoadOp == ATTACHMENT_LOAD_OP_CLEAR)) {
      pTVar11 = GetTextureFormatAttribs(pRVar10->Format);
      bVar13 = pTVar11->ComponentType == COMPONENT_TYPE_DEPTH_STENCIL;
      pOVar8 = (this->m_AttachmentClearValues).
               super__Vector_base<Diligent::OptimizedClearValue,_std::allocator<Diligent::OptimizedClearValue>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ClearDepthStencil(this,pIVar6,bVar13 + 1 + (uint)bVar13,
                        (float)pOVar8[uVar12].DepthStencil.Depth,pOVar8[uVar12].DepthStencil.Stencil
                        ,RESOURCE_STATE_TRANSITION_MODE_NONE);
    }
  }
  return;
}

Assistant:

void DeviceContextGLImpl::BeginSubpass()
{
    VERIFY_EXPR(m_pActiveRenderPass);
    VERIFY_EXPR(m_pBoundFramebuffer);
    const RenderPassDesc& RPDesc = m_pActiveRenderPass->GetDesc();
    VERIFY_EXPR(m_SubpassIndex < RPDesc.SubpassCount);
    const SubpassDesc&     SubpassDesc = RPDesc.pSubpasses[m_SubpassIndex];
    const FramebufferDesc& FBDesc      = m_pBoundFramebuffer->GetDesc();

    GLObjectWrappers::GLFrameBufferObj& RenderTargetFBO = m_pBoundFramebuffer->GetSubpassFramebuffer(m_SubpassIndex).RenderTarget;
    if (RenderTargetFBO != 0)
    {
        m_ContextState.BindFBO(RenderTargetFBO);
        m_DrawFBO              = &RenderTargetFBO;
        m_DrawBuffersCommitted = false;
    }
    else
    {
        GLuint DefaultFBOHandle = m_pSwapChain->GetDefaultFBO();
        if (m_DefaultFBO != DefaultFBOHandle)
        {
            m_DefaultFBO = GLObjectWrappers::GLFrameBufferObj{true, GLObjectWrappers::GLFBOCreateReleaseHelper{DefaultFBOHandle}};
        }
        m_ContextState.BindFBO(m_DefaultFBO);
        m_DrawFBO = nullptr;
    }


    for (Uint32 rt = 0; rt < SubpassDesc.RenderTargetAttachmentCount; ++rt)
    {
        const AttachmentReference& RTAttachmentRef = SubpassDesc.pRenderTargetAttachments[rt];
        if (RTAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED)
        {
            TextureViewGLImpl* const pRTV = ClassPtrCast<TextureViewGLImpl>(FBDesc.ppAttachments[RTAttachmentRef.AttachmentIndex]);
            if (pRTV == nullptr)
                continue;

            TextureBaseGL* const pColorTexGL = pRTV->GetTexture<TextureBaseGL>();
            pColorTexGL->TextureMemoryBarrier(
                MEMORY_BARRIER_FRAMEBUFFER, // Reads and writes via framebuffer object attachments after the
                                            // barrier will reflect data written by shaders prior to the barrier.
                                            // Additionally, framebuffer writes issued after the barrier will wait
                                            // on the completion of all shader writes issued prior to the barrier.
                m_ContextState);

            const RenderPassAttachmentDesc& AttachmentDesc = RPDesc.pAttachments[RTAttachmentRef.AttachmentIndex];
            auto                            FirstLastUse   = m_pActiveRenderPass->GetAttachmentFirstLastUse(RTAttachmentRef.AttachmentIndex);
            if (FirstLastUse.first == m_SubpassIndex && AttachmentDesc.LoadOp == ATTACHMENT_LOAD_OP_CLEAR)
            {
                ClearRenderTarget(pRTV, m_AttachmentClearValues[RTAttachmentRef.AttachmentIndex].Color, RESOURCE_STATE_TRANSITION_MODE_NONE);
            }
        }
    }

    if (SubpassDesc.pDepthStencilAttachment != nullptr)
    {
        const Uint32 DepthAttachmentIndex = SubpassDesc.pDepthStencilAttachment->AttachmentIndex;
        if (DepthAttachmentIndex != ATTACHMENT_UNUSED)
        {
            TextureViewGLImpl* const pDSV = ClassPtrCast<TextureViewGLImpl>(FBDesc.ppAttachments[DepthAttachmentIndex]);
            if (pDSV != nullptr)
            {
                TextureBaseGL* pDepthTexGL = pDSV->GetTexture<TextureBaseGL>();
                pDepthTexGL->TextureMemoryBarrier(MEMORY_BARRIER_FRAMEBUFFER, m_ContextState);

                const RenderPassAttachmentDesc& AttachmentDesc = RPDesc.pAttachments[DepthAttachmentIndex];
                auto                            FirstLastUse   = m_pActiveRenderPass->GetAttachmentFirstLastUse(DepthAttachmentIndex);
                if (FirstLastUse.first == m_SubpassIndex && AttachmentDesc.LoadOp == ATTACHMENT_LOAD_OP_CLEAR)
                {
                    const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(AttachmentDesc.Format);

                    CLEAR_DEPTH_STENCIL_FLAGS ClearFlags = CLEAR_DEPTH_FLAG;
                    if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)
                        ClearFlags |= CLEAR_STENCIL_FLAG;

                    const DepthStencilClearValue& ClearVal = m_AttachmentClearValues[DepthAttachmentIndex].DepthStencil;
                    ClearDepthStencil(pDSV, ClearFlags, ClearVal.Depth, ClearVal.Stencil, RESOURCE_STATE_TRANSITION_MODE_NONE);
                }
            }
        }
    }
}